

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomOneAction.cpp
# Opt level: O0

ActionResults * __thiscall BlueRoomOneAction::Drop(BlueRoomOneAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ActionResults *this_00;
  bool bVar4;
  allocator local_41;
  string local_40 [32];
  itemType local_20 [2];
  BlueRoomOneAction *local_18;
  BlueRoomOneAction *this_local;
  
  local_18 = this;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  bVar4 = false;
  if (iVar1 == TORCH) {
    local_20[1] = 0x1e;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_20 + 1);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    bVar4 = iVar2 == BACKPACK;
  }
  if (bVar4) {
    local_20[0] = TORCH;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_20);
    ItemWrapper::setLocation(pIVar3,B_ROOM1);
    this_00 = (ActionResults *)operator_new(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "Against your better judgement, you drop the torch to the ground. It lays at your feet looking abandoned."
               ,&local_41);
    ActionResults::ActionResults(this_00,CURRENT,(string *)local_40);
    this_local = (BlueRoomOneAction *)this_00;
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    this_local = (BlueRoomOneAction *)AbstractRoomAction::Drop(&this->super_AbstractRoomAction);
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults * BlueRoomOneAction::Drop() {
    if(commands->getMainItem() == TORCH && itemList->getValue(TORCH)->getLocation() == BACKPACK){
        itemList->getValue(TORCH)->setLocation(B_ROOM1);
        return new ActionResults(CURRENT, "Against your better judgement, you drop the torch to the ground. It lays at your feet looking abandoned.");
    } else {
        return AbstractRoomAction::Drop();
    }
}